

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O2

void __thiscall
jaegertracing::propagation::HeadersConfig::HeadersConfig
          (HeadersConfig *this,string *jaegerDebugHeader,string *jaegerBaggageHeader,
          string *traceContextHeaderName,string *traceBaggageHeaderPrefix)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  if (jaegerDebugHeader->_M_string_length == 0) {
    std::__cxx11::string::string((string *)this,"jaeger-debug-id",&local_29);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)jaegerDebugHeader);
  }
  if (jaegerBaggageHeader->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->_jaegerBaggageHeader,"jaeger-baggage",&local_2a);
  }
  else {
    std::__cxx11::string::string
              ((string *)&this->_jaegerBaggageHeader,(string *)jaegerBaggageHeader);
  }
  if (traceContextHeaderName->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->_traceContextHeaderName,"uber-trace-id",&local_2b)
    ;
  }
  else {
    std::__cxx11::string::string
              ((string *)&this->_traceContextHeaderName,(string *)traceContextHeaderName);
  }
  if (traceBaggageHeaderPrefix->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->_traceBaggageHeaderPrefix,"uberctx-",&local_2c);
  }
  else {
    std::__cxx11::string::string
              ((string *)&this->_traceBaggageHeaderPrefix,(string *)traceBaggageHeaderPrefix);
  }
  return;
}

Assistant:

HeadersConfig(const std::string& jaegerDebugHeader,
                  const std::string& jaegerBaggageHeader,
                  const std::string& traceContextHeaderName,
                  const std::string& traceBaggageHeaderPrefix)
        : _jaegerDebugHeader(jaegerDebugHeader.empty() ? kJaegerDebugHeader
                                                       : jaegerDebugHeader)
        , _jaegerBaggageHeader(jaegerBaggageHeader.empty()
                                   ? kJaegerBaggageHeader
                                   : jaegerBaggageHeader)
        , _traceContextHeaderName(traceContextHeaderName.empty()
                                      ? kTraceContextHeaderName
                                      : traceContextHeaderName)
        , _traceBaggageHeaderPrefix(traceBaggageHeaderPrefix.empty()
                                        ? kTraceBaggageHeaderPrefix
                                        : traceBaggageHeaderPrefix)
    {
    }